

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_image * nk_image_ptr(nk_image *__return_storage_ptr__,void *ptr)

{
  nk_zero(__return_storage_ptr__,0x18);
  if (ptr != (void *)0x0) {
    (__return_storage_ptr__->handle).ptr = ptr;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->region[0] = 0;
    __return_storage_ptr__->region[1] = 0;
    __return_storage_ptr__->region[2] = 0;
    __return_storage_ptr__->region[3] = 0;
    return __return_storage_ptr__;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x1346,"struct nk_image nk_image_ptr(void *)");
}

Assistant:

NK_API struct nk_image
nk_image_ptr(void *ptr)
{
    struct nk_image s;
    nk_zero(&s, sizeof(s));
    NK_ASSERT(ptr);
    s.handle.ptr = ptr;
    s.w = 0; s.h = 0;
    s.region[0] = 0;
    s.region[1] = 0;
    s.region[2] = 0;
    s.region[3] = 0;
    return s;
}